

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O2

void xPredIntraAngAdiChroma_XY(pel *pSrc,pel *dst,int i_dst,int uiDirMode,int iWidth,int iHeight)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  byte *pbVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  int xoffsets [64];
  int aiStack_238 [64];
  int aiStack_138 [66];
  
  uVar10 = 0;
  uVar8 = (ulong)(uint)iWidth;
  if (iWidth < 1) {
    uVar8 = uVar10;
  }
  while (uVar8 != uVar10) {
    bVar1 = tab_auc_dir_dxdy[1][uiDirMode][1];
    iVar7 = (int)tab_auc_dir_dxdy[1][uiDirMode][0] * (int)(uVar10 + 1);
    iVar9 = iVar7 >> (bVar1 & 0x1f);
    aiStack_238[uVar10] = iVar9;
    aiStack_138[uVar10] = (iVar7 * 0x20 >> (bVar1 & 0x1f)) + iVar9 * -0x20;
    uVar10 = uVar10 + 1;
  }
  if (iHeight < 1) {
    iHeight = 0;
  }
  iVar7 = 0;
  while (iVar7 != iHeight) {
    bVar1 = tab_auc_dir_dxdy[0][uiDirMode][1];
    iVar12 = (int)tab_auc_dir_dxdy[0][uiDirMode][0] * (iVar7 + 1);
    iVar9 = iVar12 >> (bVar1 & 0x1f);
    iVar12 = (iVar12 * 0x20 >> (bVar1 & 0x1f)) + iVar9 * -0x20;
    lVar11 = 0;
    for (lVar5 = 0; uVar8 * 2 != lVar5; lVar5 = lVar5 + 2) {
      lVar4 = (long)iVar7 - (long)*(int *)((long)aiStack_238 + lVar5 * 2);
      iVar3 = (int)lVar4;
      uVar10 = lVar11 >> 0x20;
      if (iVar3 < 0) {
        dst[uVar10] = (pel)((uint)pSrc[lVar5 - iVar9 * 2] * (iVar12 + 0x20) +
                            (uint)pSrc[lVar5 + (2 - (long)(iVar9 * 2))] * (0x40 - iVar12) +
                            (uint)pSrc[lVar5 + (4 - (long)(iVar9 * 2))] * (0x20 - iVar12) +
                            (uint)pSrc[lVar5 + (-2 - (long)(iVar9 * 2))] * iVar12 + 0x40 >> 7);
        iVar3 = (uint)pSrc[lVar5 + (1 - (long)(iVar9 * 2))] * (iVar12 + 0x20) +
                (uint)pSrc[lVar5 + (3 - (long)(iVar9 * 2))] * (0x40 - iVar12) +
                (uint)pSrc[lVar5 + (5 - (long)(iVar9 * 2))] * (0x20 - iVar12) +
                (uint)pSrc[lVar5 + (-1 - (long)(iVar9 * 2))] * iVar12;
        uVar10 = (ulong)((int)lVar5 + 1);
      }
      else {
        iVar2 = *(int *)((long)aiStack_138 + lVar5 * 2);
        pbVar6 = pSrc + lVar4 * -2;
        dst[uVar10] = (pel)((uint)pbVar6[2] * iVar2 +
                            (uint)*pbVar6 * (iVar2 + 0x20) +
                            (uint)pbVar6[-2] * (0x40 - iVar2) + (uint)pbVar6[-4] * (0x20 - iVar2) +
                            0x40 >> 7);
        iVar3 = (uint)pbVar6[3] * iVar2 +
                (uint)pSrc[(long)(iVar3 * -2) + 1] * (iVar2 + 0x20) +
                (uint)pbVar6[-1] * (0x40 - iVar2) + (uint)pbVar6[-3] * (0x20 - iVar2);
        uVar10 = uVar10 | 1;
      }
      dst[uVar10] = (pel)(iVar3 + 0x40U >> 7);
      lVar11 = lVar11 + 0x200000000;
    }
    dst = dst + i_dst;
    iVar7 = iVar7 + 1;
  }
  return;
}

Assistant:

static void xPredIntraAngAdiChroma_XY(pel *pSrc, pel *dst, int i_dst, int uiDirMode, int iWidth, int iHeight)
{
    int i, j;
    int offsetx, offsety;
    pel *rpSrc = pSrc;
    int xoffsets[64];
    int xsteps[64];

    for (i = 0; i < iWidth; i++) {
        xsteps[i] = getContextPixel(uiDirMode, 1, i + 1, &xoffsets[i]);
    }

    for (j = 0; j < iHeight; j++) {
        int srcOff = getContextPixel(uiDirMode, 0, j + 1, &offsetx) << 1;
        pel *px = pSrc - srcOff;

        for (i = 0; i < iWidth; i++, px += 2) {
            int iYy = j - xsteps[i];
            int i2 = i << 1;
            if (iYy <= -1) {
                dst[i2] = (px[4] * (32 - offsetx) + px[2] * (64 - offsetx) + px[0] * (32 + offsetx) + px[-2] * offsetx + 64) >> 7; //U
                dst[i2 + 1] = (px[5] * (32 - offsetx) + px[3] * (64 - offsetx) + px[1] * (32 + offsetx) + px[-1] * offsetx + 64) >> 7; //V
            }
            else {
                offsety = xoffsets[i];
                iYy *= 2;
                dst[i2] = (rpSrc[-iYy - 4] * (32 - offsety) + rpSrc[-iYy - 2] * (64 - offsety) + rpSrc[-iYy] * (32 + offsety) + rpSrc[-iYy + 2] * offsety + 64) >> 7; //U
                dst[i2 + 1] = (rpSrc[-iYy - 3] * (32 - offsety) + rpSrc[-iYy - 1] * (64 - offsety) + rpSrc[-iYy + 1] * (32 + offsety) + rpSrc[-iYy + 3] * offsety + 64) >> 7; //U
            }
        }
        dst += i_dst;
    }
}